

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

_Bool upb_inttable_remove(upb_inttable *t,uintptr_t key,upb_value *val)

{
  uint32_t *puVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  upb_value *puVar4;
  uintptr_t uVar5;
  _upb_tabent *p_Var6;
  byte bVar7;
  upb_key uVar8;
  upb_tabent *puVar9;
  uint uVar10;
  uintptr_t val_1;
  upb_tabent *puVar11;
  
  if (key < t->array_size) {
    puVar3 = t->presence_mask;
    if ((puVar3[key >> 3] >> ((uint)key & 7) & 1) != 0) {
      t->array_count = t->array_count - 1;
      puVar4 = t->array;
      if (val != (upb_value *)0x0) {
        val->val = puVar4[key].val;
      }
      puVar4[key].val = 0xffffffffffffffff;
      bVar7 = (byte)key & 7;
      pbVar2 = puVar3 + (key >> 3);
      *pbVar2 = *pbVar2 & (-2 << bVar7 | 0xfeU >> 8 - bVar7);
      return true;
    }
  }
  else {
    uVar10 = ((uint)(key >> 0x20) ^ (uint)key) & (t->t).mask;
    puVar9 = (t->t).entries;
    uVar5 = puVar9[uVar10].key.num;
    if (uVar5 != 0) {
      puVar9 = puVar9 + uVar10;
      if (uVar5 == key) {
        puVar1 = &(t->t).count;
        *puVar1 = *puVar1 - 1;
        if (val != (upb_value *)0x0) {
          val->val = (puVar9->val).val;
        }
        p_Var6 = puVar9->next;
        if (p_Var6 != (_upb_tabent *)0x0) {
          puVar9->next = p_Var6->next;
          uVar8 = p_Var6->key;
          (puVar9->val).val = (p_Var6->val).val;
          puVar9->key = uVar8;
          (p_Var6->key).num = 0;
          return true;
        }
        (puVar9->key).num = 0;
        return true;
      }
      for (puVar11 = puVar9->next; puVar11 != (upb_tabent *)0x0; puVar11 = puVar11->next) {
        if ((puVar11->key).num == key) {
          puVar1 = &(t->t).count;
          *puVar1 = *puVar1 - 1;
          if (val != (upb_value *)0x0) {
            val->val = (puVar11->val).val;
          }
          (puVar11->key).num = 0;
          puVar9->next = puVar11->next;
          return true;
        }
        puVar9 = puVar11;
      }
    }
  }
  return false;
}

Assistant:

bool upb_inttable_remove(upb_inttable* t, uintptr_t key, upb_value* val) {
  bool success;
  if (key < t->array_size) {
    if (upb_inttable_arrhas(t, key)) {
      t->array_count--;
      if (val) {
        *val = t->array[key];
      }
      mutable_array(t)[key] = kInttableSentinel;
      ((uint8_t*)t->presence_mask)[key / 8] &= ~(1 << (key % 8));
      success = true;
    } else {
      success = false;
    }
  } else {
    success = rm(&t->t, intkey(key), val, upb_inthash(key), &inteql);
  }
  check(t);
  return success;
}